

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.h
# Opt level: O0

int av1_is_dv_valid(MV dv,AV1_COMMON *cm,MACROBLOCKD *xd,int mi_row,int mi_col,BLOCK_SIZE bsize,
                   int mib_size_log2)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int in_ECX;
  long in_RDX;
  AV1_COMMON *in_RSI;
  uint in_EDI;
  int in_R8D;
  byte in_R9B;
  byte in_stack_00000008;
  int wf_offset;
  int gradient;
  int src_sb64;
  int active_sb64;
  int total_sb64_per_row;
  int src_sb64_col;
  int src_sb_row;
  int sb_size;
  int active_sb64_col;
  int active_sb_row;
  int max_mib_size;
  macroblockd_plane *pd;
  int tile_right_edge;
  int src_right_edge;
  int tile_bottom_edge;
  int src_bottom_edge;
  int tile_left_edge;
  int src_left_edge;
  int tile_top_edge;
  int src_top_edge;
  TileInfo *tile;
  int SCALE_PX_TO_MV;
  int bh;
  int bw;
  short local_8;
  short sStack_6;
  int local_4;
  
  bVar1 = block_size_wide[in_R9B];
  bVar2 = block_size_high[in_R9B];
  local_8 = (short)in_EDI;
  if (((in_EDI & 7) == 0) && (sStack_6 = (short)(in_EDI >> 0x10), (in_EDI & 0x70000) == 0)) {
    iVar3 = in_ECX * 0x20 + (int)local_8;
    iVar4 = *(int *)(in_RDX + 0x1ea0) * 0x20;
    if (iVar3 < iVar4) {
      local_4 = 0;
    }
    else {
      iVar5 = in_R8D * 0x20 + (int)sStack_6;
      iVar6 = *(int *)(in_RDX + 0x1ea8) * 0x20;
      if (iVar5 < iVar6) {
        local_4 = 0;
      }
      else {
        iVar7 = (in_ECX * 4 + (uint)bVar2) * 8 + (int)local_8;
        if (*(int *)(in_RDX + 0x1ea4) << 5 < iVar7) {
          local_4 = 0;
        }
        else {
          iVar8 = (in_R8D * 4 + (uint)bVar1) * 8 + (int)sStack_6;
          if (*(int *)(in_RDX + 0x1eac) << 5 < iVar8) {
            local_4 = 0;
          }
          else {
            if (((*(byte *)(in_RDX + 0xc) & 1) != 0) && (iVar9 = av1_num_planes(in_RSI), 1 < iVar9))
            {
              if ((bVar1 < 8) && ((*(int *)(in_RDX + 0xa44) != 0 && (iVar5 < iVar6 + 0x20)))) {
                return 0;
              }
              if (((bVar2 < 8) && (*(int *)(in_RDX + 0xa48) != 0)) && (iVar3 < iVar4 + 0x20)) {
                return 0;
              }
            }
            iVar3 = in_ECX >> (in_stack_00000008 & 0x1f);
            iVar4 = (in_R8D << 2) >> 6;
            iVar5 = (1 << (in_stack_00000008 & 0x1f)) << 2;
            iVar6 = ((iVar7 >> 3) + -1) / iVar5;
            iVar7 = (iVar8 >> 3) + -1 >> 6;
            iVar8 = ((*(int *)(in_RDX + 0x1eac) - *(int *)(in_RDX + 0x1ea8)) + -1 >> 4) + 1;
            if (iVar6 * iVar8 + iVar7 < iVar3 * iVar8 + iVar4 + -4) {
              if ((iVar3 < iVar6) ||
                 ((int)(iVar4 + -4 + ((0x40 < iVar5) + 5) * (iVar3 - iVar6)) <= iVar7)) {
                local_4 = 0;
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 0;
            }
          }
        }
      }
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static inline int av1_is_dv_valid(const MV dv, const AV1_COMMON *cm,
                                  const MACROBLOCKD *xd, int mi_row, int mi_col,
                                  BLOCK_SIZE bsize, int mib_size_log2) {
  const int bw = block_size_wide[bsize];
  const int bh = block_size_high[bsize];
  const int SCALE_PX_TO_MV = 8;
  // Disallow subpixel for now
  // SUBPEL_MASK is not the correct scale
  if (((dv.row & (SCALE_PX_TO_MV - 1)) || (dv.col & (SCALE_PX_TO_MV - 1))))
    return 0;

  const TileInfo *const tile = &xd->tile;
  // Is the source top-left inside the current tile?
  const int src_top_edge = mi_row * MI_SIZE * SCALE_PX_TO_MV + dv.row;
  const int tile_top_edge = tile->mi_row_start * MI_SIZE * SCALE_PX_TO_MV;
  if (src_top_edge < tile_top_edge) return 0;
  const int src_left_edge = mi_col * MI_SIZE * SCALE_PX_TO_MV + dv.col;
  const int tile_left_edge = tile->mi_col_start * MI_SIZE * SCALE_PX_TO_MV;
  if (src_left_edge < tile_left_edge) return 0;
  // Is the bottom right inside the current tile?
  const int src_bottom_edge = (mi_row * MI_SIZE + bh) * SCALE_PX_TO_MV + dv.row;
  const int tile_bottom_edge = tile->mi_row_end * MI_SIZE * SCALE_PX_TO_MV;
  if (src_bottom_edge > tile_bottom_edge) return 0;
  const int src_right_edge = (mi_col * MI_SIZE + bw) * SCALE_PX_TO_MV + dv.col;
  const int tile_right_edge = tile->mi_col_end * MI_SIZE * SCALE_PX_TO_MV;
  if (src_right_edge > tile_right_edge) return 0;

  // Special case for sub 8x8 chroma cases, to prevent referring to chroma
  // pixels outside current tile.
  if (xd->is_chroma_ref && av1_num_planes(cm) > 1) {
    const struct macroblockd_plane *const pd = &xd->plane[1];
    if (bw < 8 && pd->subsampling_x)
      if (src_left_edge < tile_left_edge + 4 * SCALE_PX_TO_MV) return 0;
    if (bh < 8 && pd->subsampling_y)
      if (src_top_edge < tile_top_edge + 4 * SCALE_PX_TO_MV) return 0;
  }

  // Is the bottom right within an already coded SB? Also consider additional
  // constraints to facilitate HW decoder.
  const int max_mib_size = 1 << mib_size_log2;
  const int active_sb_row = mi_row >> mib_size_log2;
  const int active_sb64_col = (mi_col * MI_SIZE) >> 6;
  const int sb_size = max_mib_size * MI_SIZE;
  const int src_sb_row = ((src_bottom_edge >> 3) - 1) / sb_size;
  const int src_sb64_col = ((src_right_edge >> 3) - 1) >> 6;
  const int total_sb64_per_row =
      ((tile->mi_col_end - tile->mi_col_start - 1) >> 4) + 1;
  const int active_sb64 = active_sb_row * total_sb64_per_row + active_sb64_col;
  const int src_sb64 = src_sb_row * total_sb64_per_row + src_sb64_col;
  if (src_sb64 >= active_sb64 - INTRABC_DELAY_SB64) return 0;

  // Wavefront constraint: use only top left area of frame for reference.
  const int gradient = 1 + INTRABC_DELAY_SB64 + (sb_size > 64);
  const int wf_offset = gradient * (active_sb_row - src_sb_row);
  if (src_sb_row > active_sb_row ||
      src_sb64_col >= active_sb64_col - INTRABC_DELAY_SB64 + wf_offset)
    return 0;

  return 1;
}